

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
zeGetKernelExpProcAddrTable(ze_api_version_t version,ze_kernel_exp_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_kernel_exp_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_00189718 = pDdiTable->pfnGetBinaryExp;
      pDdiTable->pfnGetBinaryExp = tracing_layer::zeKernelGetBinaryExp;
      DAT_00189708 = pDdiTable->pfnSetGlobalOffsetExp;
      DAT_00189710 = pDdiTable->pfnSchedulingHintExp;
      pDdiTable->pfnSetGlobalOffsetExp = tracing_layer::zeKernelSetGlobalOffsetExp;
      pDdiTable->pfnSchedulingHintExp = tracing_layer::zeKernelSchedulingHintExp;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_exp_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.KernelExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnSetGlobalOffsetExp                       = pDdiTable->pfnSetGlobalOffsetExp;
    pDdiTable->pfnSetGlobalOffsetExp                     = tracing_layer::zeKernelSetGlobalOffsetExp;

    dditable.pfnGetBinaryExp                             = pDdiTable->pfnGetBinaryExp;
    pDdiTable->pfnGetBinaryExp                           = tracing_layer::zeKernelGetBinaryExp;

    dditable.pfnSchedulingHintExp                        = pDdiTable->pfnSchedulingHintExp;
    pDdiTable->pfnSchedulingHintExp                      = tracing_layer::zeKernelSchedulingHintExp;

    return result;
}